

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O0

void logical_or_with_cancel_combine_accum_help(int x,int *accum)

{
  undefined4 local_1c;
  int *accum_local;
  int x_local;
  
  if (x != 0x7ffffffe) {
    if (x == 0x7fffffff) {
      if (*accum == 0x7ffffffe) {
        *accum = 0x7fffffff;
      }
    }
    else if ((*accum == 0x7fffffff) || (*accum == 0x7ffffffe)) {
      if (x < 1) {
        local_1c = 0;
        if (x < 0) {
          local_1c = 2;
        }
      }
      else {
        local_1c = 1;
      }
      *accum = local_1c;
    }
    else if (x < 1) {
      if (x < 0) {
        *accum = *accum | 2;
      }
    }
    else {
      *accum = *accum | 1;
    }
  }
  return;
}

Assistant:

static void logical_or_with_cancel_combine_accum_help(int x, int *accum)
{
	if (x == UI_ENTRY_VALUE_NOT_PRESENT) {
		return;
	}
	if (x == UI_ENTRY_UNKNOWN_VALUE) {
		if (*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			*accum = UI_ENTRY_UNKNOWN_VALUE;
		}
		return;
	}
	if (*accum == UI_ENTRY_UNKNOWN_VALUE ||
		*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
		*accum = (x > 0) ? 1 : ((x < 0) ? 2 : 0);
	} else if (x > 0) {
		*accum |= 1;
	} else if (x < 0) {
		*accum |= 2;
	}
}